

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomShaderTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::anon_unknown_1::TextureGroup::init(TextureGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *node;
  TestNode *node_00;
  RandomShaderCase *pRVar1;
  int seed;
  deUint32 dVar2;
  ProgramParameters params;
  ProgramParameters local_98;
  
  local_98.vertexParameters.randomize = false;
  local_98.seed = 0;
  local_98.version = VERSION_100;
  local_98.vertexParameters.maxStatementDepth = 2;
  local_98.vertexParameters.maxStatementsPerBlock = 10;
  local_98.vertexParameters.maxExpressionDepth = 5;
  local_98.vertexParameters.maxCombinedVariableScalars = 0x20;
  local_98.vertexParameters.maxUniformScalars = 0x200;
  local_98.vertexParameters.maxInputVariables = 8;
  local_98.fragmentParameters.randomize = false;
  local_98.fragmentParameters.maxStatementDepth = 2;
  local_98.fragmentParameters.maxStatementsPerBlock = 10;
  local_98.fragmentParameters.maxExpressionDepth = 5;
  local_98.fragmentParameters.maxCombinedVariableScalars = 0x20;
  local_98.fragmentParameters.maxUniformScalars = 0x200;
  local_98.fragmentParameters.maxInputVariables = 8;
  local_98.declarationStatementBaseWeight = true;
  local_98.trigonometricBaseWeight = 0.0;
  local_98.exponentialBaseWeight = 0.0;
  local_98.useScalarConversions = true;
  local_98.useSwizzle = true;
  local_98.useComparisonOps = false;
  local_98.useConditionals = false;
  local_98.vertexParameters.texLookupBaseWeight = 10.0;
  local_98.vertexParameters.maxSamplers = 8;
  local_98.vertexParameters.useTexture2D = true;
  local_98.vertexParameters.useTextureCube = true;
  local_98.fragmentParameters.texLookupBaseWeight = 10.0;
  local_98.fragmentParameters.maxSamplers = 8;
  local_98.fragmentParameters.useTexture2D = true;
  local_98.fragmentParameters.useTextureCube = true;
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"vertex",
             "Vertex-only tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fragment",
             "Fragment-only tests");
  tcu::TestNode::addChild((TestNode *)this,node_00);
  dVar2 = 0;
  do {
    pRVar1 = createRandomShaderCase
                       ((this->super_TestCaseGroup).m_context,"Texture lookups in vertex shader",
                        &local_98,dVar2,true,false);
    tcu::TestNode::addChild(node,(TestNode *)pRVar1);
    dVar2 = dVar2 + 1;
  } while (dVar2 != 0x32);
  dVar2 = 0;
  do {
    pRVar1 = createRandomShaderCase
                       ((this->super_TestCaseGroup).m_context,"Texture lookups in fragment shader",
                        &local_98,dVar2,false,true);
    tcu::TestNode::addChild(node_00,(TestNode *)pRVar1);
    dVar2 = dVar2 + 1;
  } while (dVar2 != 0x96);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		rsg::ProgramParameters params;
		params.useScalarConversions						= true;
		params.useSwizzle								= true;
		params.vertexParameters.texLookupBaseWeight		= 10.0f;
		params.vertexParameters.useTexture2D			= true;
		params.vertexParameters.useTextureCube			= true;
		params.fragmentParameters.texLookupBaseWeight	= 10.0f;
		params.fragmentParameters.useTexture2D			= true;
		params.fragmentParameters.useTextureCube		= true;

		tcu::TestCaseGroup* vertexGroup = new tcu::TestCaseGroup(m_testCtx, "vertex", "Vertex-only tests");
		addChild(vertexGroup);

		tcu::TestCaseGroup* fragmentGroup = new tcu::TestCaseGroup(m_testCtx, "fragment", "Fragment-only tests");
		addChild(fragmentGroup);

		// Do only 50 vertex cases and 150 fragment cases.
		for (int seed = 0; seed < 50; seed++)
			vertexGroup->addChild(createRandomShaderCase(m_context,		"Texture lookups in vertex shader",		params, seed, true, false));

		for (int seed = 0; seed < 150; seed++)
			fragmentGroup->addChild(createRandomShaderCase(m_context,	"Texture lookups in fragment shader",	params, seed, false, true));
	}